

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assume_tests.cpp
# Opt level: O0

void __thiscall iu_AssumeTest_x_iutest_x_B_Test::Body(iu_AssumeTest_x_iutest_x_B_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  type **in_stack_fffffffffffffba8;
  AssertionHelper local_418;
  Fixed local_3e8;
  int local_260;
  char local_25c [4];
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  string local_228;
  AssertionHelper local_208;
  Fixed local_1d8;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssumeTest_x_iutest_x_B_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_39 = false;
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_38,&local_39);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_228,(internal *)local_38,(AssertionResult *)"true","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
               ,0x27,pcVar2,kAssumeFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_25c[0] = '\0';
    local_25c[1] = '\0';
    local_25c[2] = '\0';
    local_25c[3] = '\0';
    local_260 = 1;
    iutest::internal::backward::EqHelper<true>::Compare<int,int>
              ((AssertionResult *)local_258,(EqHelper<true> *)0x16d7e3,"1",local_25c,&local_260,
               (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffba8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      memset(&local_3e8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_258);
      iutest::AssertionHelper::AssertionHelper
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assume_tests.cpp"
                 ,0x28,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=(&local_418,&local_3e8);
      iutest::AssertionHelper::~AssertionHelper(&local_418);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  }
  return;
}

Assistant:

IUTEST(AssumeTest, B)
{
    IUTEST_ASSUME_FALSE(true);
    IUTEST_ASSERT_EQ(0, 1);
}